

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

BigNum * solve_system(BigNum *__return_storage_ptr__,
                     vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                     *equations)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference ppVar4;
  BigNum local_420;
  BigNum local_400;
  BigNum local_3e0;
  BigNum local_3c0;
  BigNum local_3a0;
  BigNum local_380;
  BigNum local_360;
  BigNum local_340;
  BigNum local_320;
  BigNum local_300;
  pair<BigNum,_BigNum> local_2e0;
  BigNum local_2a0;
  BigNum local_280;
  BigNum local_260;
  BigNum local_240;
  BigNum local_220;
  BigNum local_200;
  BigNum local_1e0;
  BigNum local_1c0;
  BigNum local_1a0;
  BigNum local_180;
  undefined1 local_160 [8];
  BigNum new_first;
  pair<BigNum,_BigNum> pr;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *__range1_1;
  undefined1 local_e0 [8];
  BigNum all_mod;
  BigNum local_a0;
  undefined1 local_70 [8];
  pair<BigNum,_BigNum> equation;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *__range1;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *equations_local;
  BigNum *result;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Solving system of ");
  sVar3 = std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::size
                    (equations);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," equations:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::
           begin(equations);
  equation.second._24_8_ =
       std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::end
                 (equations);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<BigNum,_BigNum>_*,_std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>_>
                                     *)&equation.second.length), bVar1) {
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<BigNum,_BigNum>_*,_std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>_>
             ::operator*(&__end1);
    std::pair<BigNum,_BigNum>::pair((pair<BigNum,_BigNum> *)local_70,ppVar4);
    std::operator<<((ostream *)&std::cout,"x = ");
    BigNum::BigNum(&local_a0,(BigNum *)local_70);
    print(&local_a0);
    BigNum::~BigNum(&local_a0);
    std::operator<<((ostream *)&std::cout," (mod ");
    BigNum::BigNum((BigNum *)&all_mod.length,(BigNum *)&equation.first.length);
    print((BigNum *)&all_mod.length);
    BigNum::~BigNum((BigNum *)&all_mod.length);
    poVar2 = std::operator<<((ostream *)&std::cout,");");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::pair<BigNum,_BigNum>::~pair((pair<BigNum,_BigNum> *)local_70);
    __gnu_cxx::
    __normal_iterator<std::pair<BigNum,_BigNum>_*,_std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>_>
    ::operator++(&__end1);
  }
  BigNum::BigNum((BigNum *)local_e0,1);
  BigNum::BigNum(__return_storage_ptr__,0);
  __end1_1 = std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::
             begin(equations);
  pr.second._24_8_ =
       std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::end
                 (equations);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::pair<BigNum,_BigNum>_*,_std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>_>
                             *)&pr.second.length), bVar1) {
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<BigNum,_BigNum>_*,_std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>_>
             ::operator*(&__end1_1);
    std::pair<BigNum,_BigNum>::pair((pair<BigNum,_BigNum> *)&new_first.length,ppVar4);
    BigNum::BigNum(&local_180,(BigNum *)&new_first.length);
    BigNum::BigNum(&local_1a0,__return_storage_ptr__);
    operator-((BigNum *)local_160,&local_180,&local_1a0);
    BigNum::~BigNum(&local_1a0);
    BigNum::~BigNum(&local_180);
    while (((new_first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_1_ ^ 0xff) & 1) != 0) {
      BigNum::BigNum(&local_1e0,(BigNum *)local_160);
      BigNum::BigNum(&local_200,(BigNum *)&pr.first.length);
      operator+(&local_1c0,&local_1e0,&local_200);
      BigNum::operator=((BigNum *)local_160,&local_1c0);
      BigNum::~BigNum(&local_1c0);
      BigNum::~BigNum(&local_200);
      BigNum::~BigNum(&local_1e0);
    }
    BigNum::BigNum(&local_240,(BigNum *)local_160);
    BigNum::BigNum(&local_280,(BigNum *)local_e0);
    BigNum::BigNum(&local_2a0,(BigNum *)&pr.first.length);
    reverseByMod(&local_260,&local_280,&local_2a0);
    operator*(&local_220,&local_240,&local_260);
    BigNum::operator=((BigNum *)local_160,&local_220);
    BigNum::~BigNum(&local_220);
    BigNum::~BigNum(&local_260);
    BigNum::~BigNum(&local_2a0);
    BigNum::~BigNum(&local_280);
    BigNum::~BigNum(&local_240);
    BigNum::BigNum(&local_300,(BigNum *)local_160);
    BigNum::BigNum(&local_320,(BigNum *)&pr.first.length);
    pairDivMod(&local_2e0,&local_300,&local_320);
    BigNum::operator=((BigNum *)local_160,&local_2e0.second);
    std::pair<BigNum,_BigNum>::~pair(&local_2e0);
    BigNum::~BigNum(&local_320);
    BigNum::~BigNum(&local_300);
    BigNum::BigNum(&local_360,__return_storage_ptr__);
    BigNum::BigNum(&local_3a0,(BigNum *)local_160);
    BigNum::BigNum(&local_3c0,(BigNum *)local_e0);
    operator*(&local_380,&local_3a0,&local_3c0);
    operator+(&local_340,&local_360,&local_380);
    BigNum::operator=(__return_storage_ptr__,&local_340);
    BigNum::~BigNum(&local_340);
    BigNum::~BigNum(&local_380);
    BigNum::~BigNum(&local_3c0);
    BigNum::~BigNum(&local_3a0);
    BigNum::~BigNum(&local_360);
    BigNum::BigNum(&local_400,(BigNum *)local_e0);
    BigNum::BigNum(&local_420,(BigNum *)&pr.first.length);
    operator*(&local_3e0,&local_400,&local_420);
    BigNum::operator=((BigNum *)local_e0,&local_3e0);
    BigNum::~BigNum(&local_3e0);
    BigNum::~BigNum(&local_420);
    BigNum::~BigNum(&local_400);
    BigNum::~BigNum((BigNum *)local_160);
    std::pair<BigNum,_BigNum>::~pair((pair<BigNum,_BigNum> *)&new_first.length);
    __gnu_cxx::
    __normal_iterator<std::pair<BigNum,_BigNum>_*,_std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>_>
    ::operator++(&__end1_1);
  }
  BigNum::~BigNum((BigNum *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

BigNum solve_system(vector<std::pair<BigNum, BigNum>> equations){ // num and mod
    cout << "Solving system of " << equations.size() << " equations:" << endl;
    for(auto equation : equations){
        cout << "x = ";
        print(equation.first);
        cout <<  " (mod ";
        print(equation.second);
        cout << ");" << endl;
    }
    BigNum all_mod = BigNum(1);
    BigNum result = BigNum(0);
    for (auto pr : equations){
        BigNum new_first = (pr.first - result);
        while (!new_first.sign){
            new_first = new_first + pr.second;
        }
        new_first = new_first * reverseByMod(all_mod, pr.second);
        new_first = pairDivMod(new_first, pr.second).second;
        result = result + new_first * all_mod; // 2 17
        all_mod = all_mod * pr.second; // 5 35
    }
    return result;
}